

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O0

size_t tool_read_cb(void *buffer,size_t sz,size_t nmemb,void *userdata)

{
  int *piVar1;
  InStruct *in;
  ssize_t rc;
  void *userdata_local;
  size_t nmemb_local;
  size_t sz_local;
  void *buffer_local;
  
  in = (InStruct *)read(*userdata,buffer,sz * nmemb);
  if ((long)in < 0) {
    piVar1 = __errno_location();
    if (*piVar1 == 0xb) {
      piVar1 = __errno_location();
      *piVar1 = 0;
      *(undefined1 *)(*(long *)((long)userdata + 8) + 0x2ea) = 1;
      return 0x10000001;
    }
    in = (InStruct *)0x0;
  }
  *(undefined1 *)(*(long *)((long)userdata + 8) + 0x2ea) = 0;
  return (size_t)in;
}

Assistant:

size_t tool_read_cb(void *buffer, size_t sz, size_t nmemb, void *userdata)
{
  ssize_t rc;
  struct InStruct *in = userdata;

  rc = read(in->fd, buffer, sz*nmemb);
  if(rc < 0) {
    if(errno == EAGAIN) {
      errno = 0;
      in->config->readbusy = TRUE;
      return CURL_READFUNC_PAUSE;
    }
    /* since size_t is unsigned we can't return negative values fine */
    rc = 0;
  }
  in->config->readbusy = FALSE;
  return (size_t)rc;
}